

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLGETOBJECTLABELPROC epoxy_glGetObjectLabel_resolver(void)

{
  PFNGLGETOBJECTLABELPROC p_Var1;
  
  p_Var1 = (PFNGLGETOBJECTLABELPROC)
           gl_provider_resolver
                     ("glGetObjectLabel",epoxy_glGetObjectLabel_resolver::providers,
                      epoxy_glGetObjectLabel_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLGETOBJECTLABELPROC
epoxy_glGetObjectLabel_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_3,
        GL_extension_GL_KHR_debug,
        GL_extension_GL_KHR_debug,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        21350 /* "glGetObjectLabel" */,
        21350 /* "glGetObjectLabel" */,
        21387 /* "glGetObjectLabelKHR" */,
    };
    return gl_provider_resolver(entrypoint_strings + 21350 /* "glGetObjectLabel" */,
                                providers, entrypoints);
}